

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O3

bool duckdb::GetBooleanValue(string *loption,Value *val)

{
  pointer pcVar1;
  BinderException *this;
  bool bVar2;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (val->is_null != true) {
    bVar2 = BooleanValue::Get(val);
    return bVar2;
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"read_csv %s cannot be NULL","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  pcVar1 = (loption->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + loption->_M_string_length);
  BinderException::BinderException<std::__cxx11::string>(this,&local_68,&local_48);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool GetBooleanValue(const string &loption, const Value &val) {
	if (val.IsNull()) {
		throw BinderException("read_csv %s cannot be NULL", loption);
	}
	return BooleanValue::Get(val);
}